

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::LSTMParams::ByteSizeLong(LSTMParams *this)

{
  bool bVar1;
  int size;
  long lVar2;
  float fVar3;
  int cached_size;
  uint32_t raw_cellclipthreshold;
  float tmp_cellclipthreshold;
  uint32_t cached_has_bits;
  size_t total_size;
  LSTMParams *this_local;
  
  _tmp_cellclipthreshold = 0;
  fVar3 = _internal_cellclipthreshold(this);
  if (fVar3 != 0.0) {
    _tmp_cellclipthreshold = 6;
  }
  bVar1 = _internal_sequenceoutput(this);
  if (bVar1) {
    _tmp_cellclipthreshold = _tmp_cellclipthreshold + 2;
  }
  bVar1 = _internal_hasbiasvectors(this);
  if (bVar1) {
    _tmp_cellclipthreshold = _tmp_cellclipthreshold + 3;
  }
  bVar1 = _internal_forgetbias(this);
  if (bVar1) {
    _tmp_cellclipthreshold = _tmp_cellclipthreshold + 3;
  }
  bVar1 = _internal_haspeepholevectors(this);
  if (bVar1) {
    _tmp_cellclipthreshold = _tmp_cellclipthreshold + 3;
  }
  bVar1 = _internal_coupledinputandforgetgate(this);
  if (bVar1) {
    _tmp_cellclipthreshold = _tmp_cellclipthreshold + 3;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar2 = std::__cxx11::string::size();
    _tmp_cellclipthreshold = lVar2 + _tmp_cellclipthreshold;
  }
  size = google::protobuf::internal::ToCachedSize(_tmp_cellclipthreshold);
  SetCachedSize(this,size);
  return _tmp_cellclipthreshold;
}

Assistant:

size_t LSTMParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.LSTMParams)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // float cellClipThreshold = 60;
  static_assert(sizeof(uint32_t) == sizeof(float), "Code assumes uint32_t and float are the same size.");
  float tmp_cellclipthreshold = this->_internal_cellclipthreshold();
  uint32_t raw_cellclipthreshold;
  memcpy(&raw_cellclipthreshold, &tmp_cellclipthreshold, sizeof(tmp_cellclipthreshold));
  if (raw_cellclipthreshold != 0) {
    total_size += 2 + 4;
  }

  // bool sequenceOutput = 10;
  if (this->_internal_sequenceoutput() != 0) {
    total_size += 1 + 1;
  }

  // bool hasBiasVectors = 20;
  if (this->_internal_hasbiasvectors() != 0) {
    total_size += 2 + 1;
  }

  // bool forgetBias = 30;
  if (this->_internal_forgetbias() != 0) {
    total_size += 2 + 1;
  }

  // bool hasPeepholeVectors = 40;
  if (this->_internal_haspeepholevectors() != 0) {
    total_size += 2 + 1;
  }

  // bool coupledInputAndForgetGate = 50;
  if (this->_internal_coupledinputandforgetgate() != 0) {
    total_size += 2 + 1;
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}